

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O3

Vec_Vec_t * Saig_ManDetectConstrFunc(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  undefined1 (*pauVar1) [16];
  byte *pbVar2;
  Aig_Obj_t *pAVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  Aig_Man_t *p_00;
  Cnf_Dat_t *pCVar7;
  sat_solver *s;
  void **ppvVar8;
  Bar_Progress_t *p_01;
  Vec_Vec_t *p_02;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  void *pvVar16;
  undefined4 in_register_00000034;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iPat;
  Cnf_Dat_t *local_78;
  ulong local_70;
  sat_solver *local_68;
  ulong local_60;
  ulong local_58;
  Vec_Ptr_t *local_50;
  int Lit;
  void **local_40;
  Aig_Man_t *local_38;
  
  local_58 = CONCAT44(in_register_00000034,nFrames);
  local_60 = CONCAT44(local_60._4_4_,nProps);
  iPat = 0;
  if (p->nTruePos != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x2a1,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
  }
  p_00 = Saig_ManUnrollCOI(p,nFrames);
  if (p_00->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(pFrames) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x2ab,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
  }
  if (fVerbose == 0) {
    iVar5 = 1;
  }
  else {
    printf("Detecting constraints with %d frames, %d conflicts, and %d propagations.\n",local_58,
           (ulong)(uint)nConfs,local_60 & 0xffffffff);
    printf("Frames: ");
    Aig_ManPrintStats(p_00);
    iVar5 = p_00->nObjs[3];
  }
  pCVar7 = Cnf_DeriveSimple(p_00,iVar5);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(pCVar7,1,0);
  if (p_00->vCos->nSize < 1) {
LAB_00652d65:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  Lit = pCVar7->pVarNums[*(int *)((long)*p_00->vCos->pArray + 0x24)] * 2;
  iVar5 = sat_solver_solve(s,&Lit,(lit *)&local_40,(long)nConfs,0,0,0);
  if (iVar5 != 1) {
    if (iVar5 == 0) {
      puts("Solver could not solve the original problem.");
      Cnf_DataFree(pCVar7);
      sat_solver_delete(s);
      Aig_ManStop(p_00);
      return (Vec_Vec_t *)0x0;
    }
    if (iVar5 != -1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                    ,0x2cc,"Vec_Vec_t *Saig_ManDetectConstrFunc(Aig_Man_t *, int, int, int, int)");
    }
    p_02 = (Vec_Vec_t *)0x0;
    printf("The problem is trivially UNSAT (inductive with k=%d).\n",(ulong)((int)local_58 - 1));
    Cnf_DataFree(pCVar7);
    sat_solver_delete(s);
    goto LAB_00652d2c;
  }
  iVar5 = p_00->vObjs->nSize;
  lVar17 = (long)iVar5;
  ppvVar8 = (void **)malloc(lVar17 * 0x48);
  auVar4 = _DAT_008403e0;
  if (0 < lVar17) {
    lVar15 = lVar17 + -1;
    auVar20._8_4_ = (int)lVar15;
    auVar20._0_8_ = lVar15;
    auVar20._12_4_ = (int)((ulong)lVar15 >> 0x20);
    lVar15 = 0;
    auVar20 = auVar20 ^ _DAT_008403e0;
    auVar21 = _DAT_008403d0;
    do {
      auVar22 = auVar21 ^ auVar4;
      lVar11 = auVar21._8_8_;
      if ((bool)(~(auVar22._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar22._0_4_ ||
                  auVar20._4_4_ < auVar22._4_4_) & 1)) {
        *(void ***)((long)ppvVar8 + lVar15) = ppvVar8 + lVar17 + auVar21._0_8_ * 8;
      }
      if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
          auVar22._12_4_ <= auVar20._12_4_) {
        *(void ***)((long)ppvVar8 + lVar15 + 8) = ppvVar8 + lVar17 + lVar11 * 8;
      }
      auVar21._0_8_ = auVar21._0_8_ + 2;
      auVar21._8_8_ = lVar11 + 2;
      lVar15 = lVar15 + 0x10;
    } while ((ulong)(iVar5 + 1U >> 1) << 4 != lVar15);
  }
  local_50 = (Vec_Ptr_t *)malloc(0x10);
  local_50->nSize = iVar5;
  local_50->nCap = iVar5;
  local_50->pArray = ppvVar8;
  if (0 < iVar5) {
    lVar15 = 0;
    do {
      pauVar1 = (undefined1 (*) [16])ppvVar8[lVar15];
      pauVar1[3] = (undefined1  [16])0x0;
      pauVar1[2] = (undefined1  [16])0x0;
      pauVar1[1] = (undefined1  [16])0x0;
      *pauVar1 = (undefined1  [16])0x0;
      lVar15 = lVar15 + 1;
    } while (lVar17 != lVar15);
  }
  Saig_CollectSatValues(s,pCVar7,local_50,&iPat);
  pVVar10 = p_00->vObjs;
  iVar5 = pVVar10->nSize;
  if (0 < iVar5) {
    lVar15 = 0;
    do {
      if (pVVar10->pArray[lVar15] != (void *)0x0) {
        if (lVar17 <= lVar15) goto LAB_00652d65;
        pbVar2 = (byte *)ppvVar8[lVar15];
        if ((*pbVar2 & 1) != 0) {
          pbVar2[0x30] = 0xff;
          pbVar2[0x31] = 0xff;
          pbVar2[0x32] = 0xff;
          pbVar2[0x33] = 0xff;
          pbVar2[0x34] = 0xff;
          pbVar2[0x35] = 0xff;
          pbVar2[0x36] = 0xff;
          pbVar2[0x37] = 0xff;
          pbVar2[0x38] = 0xff;
          pbVar2[0x39] = 0xff;
          pbVar2[0x3a] = 0xff;
          pbVar2[0x3b] = 0xff;
          pbVar2[0x3c] = 0xff;
          pbVar2[0x3d] = 0xff;
          pbVar2[0x3e] = 0xff;
          pbVar2[0x3f] = 0xff;
          pbVar2[0x20] = 0xff;
          pbVar2[0x21] = 0xff;
          pbVar2[0x22] = 0xff;
          pbVar2[0x23] = 0xff;
          pbVar2[0x24] = 0xff;
          pbVar2[0x25] = 0xff;
          pbVar2[0x26] = 0xff;
          pbVar2[0x27] = 0xff;
          pbVar2[0x28] = 0xff;
          pbVar2[0x29] = 0xff;
          pbVar2[0x2a] = 0xff;
          pbVar2[0x2b] = 0xff;
          pbVar2[0x2c] = 0xff;
          pbVar2[0x2d] = 0xff;
          pbVar2[0x2e] = 0xff;
          pbVar2[0x2f] = 0xff;
          pbVar2[0x10] = 0xff;
          pbVar2[0x11] = 0xff;
          pbVar2[0x12] = 0xff;
          pbVar2[0x13] = 0xff;
          pbVar2[0x14] = 0xff;
          pbVar2[0x15] = 0xff;
          pbVar2[0x16] = 0xff;
          pbVar2[0x17] = 0xff;
          pbVar2[0x18] = 0xff;
          pbVar2[0x19] = 0xff;
          pbVar2[0x1a] = 0xff;
          pbVar2[0x1b] = 0xff;
          pbVar2[0x1c] = 0xff;
          pbVar2[0x1d] = 0xff;
          pbVar2[0x1e] = 0xff;
          pbVar2[0x1f] = 0xff;
          pbVar2[0] = 0xff;
          pbVar2[1] = 0xff;
          pbVar2[2] = 0xff;
          pbVar2[3] = 0xff;
          pbVar2[4] = 0xff;
          pbVar2[5] = 0xff;
          pbVar2[6] = 0xff;
          pbVar2[7] = 0xff;
          pbVar2[8] = 0xff;
          pbVar2[9] = 0xff;
          pbVar2[10] = 0xff;
          pbVar2[0xb] = 0xff;
          pbVar2[0xc] = 0xff;
          pbVar2[0xd] = 0xff;
          pbVar2[0xe] = 0xff;
          pbVar2[0xf] = 0xff;
          pVVar10 = p_00->vObjs;
        }
      }
      lVar15 = lVar15 + 1;
      iVar5 = pVVar10->nSize;
    } while (lVar15 < iVar5);
  }
  local_78 = pCVar7;
  local_40 = ppvVar8;
  p_01 = Bar_ProgressStart(_stdout,iVar5);
  Aig_ManCleanMarkAB(p_00);
  pVVar10 = p_00->vObjs;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    local_70 = local_70 & 0xffffffff00000000;
    local_68 = s;
LAB_00652875:
    pAVar3 = (Aig_Obj_t *)pVVar10->pArray[lVar15];
    if ((pAVar3 == (Aig_Obj_t *)0x0) ||
       ((uVar6 = *(uint *)&pAVar3->field_0x18 & 7, uVar6 != 2 && (1 < uVar6 - 5))))
    goto LAB_0065297a;
    if ((p_01 == (Bar_Progress_t *)0x0) || (p_01->nItemsNext <= lVar15)) {
      Bar_ProgressUpdate_int(p_01,(int)lVar15,(char *)0x0);
    }
    if (lVar15 < lVar17) {
      lVar11 = -0x40;
      do {
        if (*(int *)((long)local_40[lVar15] + lVar11 + 0x40) != -1) {
          if (lVar11 != 0) {
            lVar11 = 0;
            goto LAB_006528e6;
          }
          break;
        }
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0);
      iVar5 = Saig_DetectTryPolarity
                        (local_68,nConfs,(int)local_60,local_78,pAVar3,0,local_50,&iPat,fVerbose);
      uVar12 = 0x10;
      goto LAB_0065296e;
    }
    goto LAB_00652d65;
  }
  Bar_ProgressStop(p_01);
  p_02 = (Vec_Vec_t *)0x0;
  pCVar7 = local_78;
LAB_00652cfb:
  if (local_40 != (void **)0x0) {
    free(local_40);
  }
  free(local_50);
  Cnf_DataFree(pCVar7);
  sat_solver_delete(s);
  Aig_ManCleanMarkAB(p_00);
LAB_00652d2c:
  Aig_ManStop(p_00);
  return p_02;
  while (lVar11 = lVar11 + 1, lVar11 != 0x10) {
LAB_006528e6:
    if (*(int *)((long)local_40[lVar15] + lVar11 * 4) != 0) goto LAB_0065297a;
  }
  iVar5 = Saig_DetectTryPolarity
                    (local_68,nConfs,(int)local_60,local_78,pAVar3,1,local_50,&iPat,fVerbose);
  uVar12 = 0x20;
LAB_0065296e:
  if (iVar5 != 0) {
    *(ulong *)&pAVar3->field_0x18 = *(ulong *)&pAVar3->field_0x18 | uVar12;
    local_70 = CONCAT44(local_70._4_4_,(int)local_70 + 1);
  }
LAB_0065297a:
  lVar15 = lVar15 + 1;
  pVVar10 = p_00->vObjs;
  if (pVVar10->nSize <= lVar15) goto code_r0x0065298e;
  goto LAB_00652875;
code_r0x0065298e:
  Bar_ProgressStop(p_01);
  if ((int)local_70 == 0) {
    p_02 = (Vec_Vec_t *)0x0;
    s = local_68;
    pCVar7 = local_78;
  }
  else {
    if (fVerbose != 0) {
      printf("Found %3d classes of candidates.\n");
    }
    p_02 = (Vec_Vec_t *)malloc(0x10);
    uVar12 = 8;
    if (6 < (int)local_58 - 1U) {
      uVar12 = local_58 & 0xffffffff;
    }
    p_02->nSize = 0;
    iVar5 = (int)uVar12;
    p_02->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      ppvVar8 = (void **)malloc((long)iVar5 << 3);
    }
    iVar5 = (int)uVar12;
    p_02->pArray = ppvVar8;
    local_38 = p_00;
    if (0 < (int)local_58) {
      local_60 = local_58 & 0xffffffff;
      pVVar10 = p->vObjs;
      uVar18 = 0xffffffff;
      uVar19 = 0;
      uVar13 = local_58;
      do {
        if (0 < pVVar10->nSize) {
          local_70 = uVar18 + 1;
          lVar17 = 0;
          do {
            pvVar16 = pVVar10->pArray[lVar17];
            if ((pvVar16 != (void *)0x0) &&
               (((uVar6 = *(uint *)((long)pvVar16 + 0x18) & 7, uVar6 == 2 || (uVar6 - 5 < 2)) &&
                (pAVar3 = p->pObjCopies[(int)(((int)lVar17 + 1) * (int)uVar13 + ~(uint)uVar19)],
                pAVar3 != (Aig_Obj_t *)0x0)))) {
              uVar12 = *(ulong *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18);
              if ((uVar12 & 0x10) == 0) {
                if ((uVar12 & 0x20) == 0) goto LAB_00652b82;
                pvVar16 = (void *)((ulong)((uint)pAVar3 & 1) ^ (ulong)pvVar16);
                if (uVar19 == 0) goto LAB_00652b69;
                uVar6 = p_02->nSize;
                if (p_02->nSize < 1) {
                  uVar6 = 0;
                }
                uVar12 = 0;
                do {
                  if (uVar12 == uVar6) {
LAB_00652d46:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                  }
                  lVar15 = (long)*(int *)((long)p_02->pArray[uVar12] + 4);
                  if (0 < lVar15) {
                    lVar11 = 0;
                    do {
                      uVar9 = uVar12;
                      if (*(void **)(*(long *)((long)p_02->pArray[uVar12] + 8) + lVar11 * 8) ==
                          pvVar16) goto LAB_00652b6b;
                      lVar11 = lVar11 + 1;
                    } while (lVar15 != lVar11);
                  }
                  uVar12 = uVar12 + 1;
                  uVar9 = local_70;
                } while (uVar12 != uVar19);
              }
              else {
                pvVar16 = (void *)((ulong)((uint)pAVar3 & 1) ^ (ulong)pvVar16 ^ 1);
                if (uVar19 == 0) {
LAB_00652b69:
                  uVar9 = 0;
                }
                else {
                  uVar6 = p_02->nSize;
                  if (p_02->nSize < 1) {
                    uVar6 = 0;
                  }
                  uVar12 = 0;
                  do {
                    if (uVar12 == uVar6) goto LAB_00652d46;
                    lVar15 = (long)*(int *)((long)p_02->pArray[uVar12] + 4);
                    if (0 < lVar15) {
                      lVar11 = 0;
                      do {
                        uVar9 = uVar12;
                        if (*(void **)(*(long *)((long)p_02->pArray[uVar12] + 8) + lVar11 * 8) ==
                            pvVar16) goto LAB_00652b6b;
                        lVar11 = lVar11 + 1;
                      } while (lVar15 != lVar11);
                    }
                    uVar12 = uVar12 + 1;
                    uVar9 = local_70;
                  } while (uVar12 != uVar19);
                }
              }
LAB_00652b6b:
              if ((uVar9 & 0xffffffff) == uVar19) {
                Vec_VecPush(p_02,(uint)uVar19,pvVar16);
                uVar13 = local_58;
              }
            }
LAB_00652b82:
            lVar17 = lVar17 + 1;
            pVVar10 = p->vObjs;
            uVar12 = (ulong)pVVar10->nSize;
          } while (lVar17 < (long)uVar12);
        }
        iVar5 = (int)uVar12;
        uVar19 = uVar19 + 1;
        uVar18 = (ulong)((int)uVar18 + 1);
      } while (uVar19 != local_60);
    }
    if (fVerbose != 0) {
      iVar14 = p_02->nSize;
      uVar12 = (ulong)iVar14;
      if ((long)uVar12 < 1) {
        printf("Found %3d candidates.\n",0);
      }
      else {
        uVar13 = 0;
        uVar18 = 0;
        do {
          uVar18 = (ulong)(uint)((int)uVar18 + *(int *)((long)p_02->pArray[uVar13] + 4));
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
        printf("Found %3d candidates.\n",uVar18);
        iVar5 = (int)uVar13;
        if (0 < iVar14) {
          ppvVar8 = p_02->pArray;
          uVar18 = 0;
          do {
            printf("Level %d. Cands  =%d    ",uVar18 & 0xffffffff,
                   (ulong)*(uint *)((long)ppvVar8[uVar18] + 4));
            putchar(10);
            iVar5 = (int)uVar13;
            uVar18 = uVar18 + 1;
          } while (uVar12 != uVar18);
        }
      }
    }
    if (p->pObjCopies != (Aig_Obj_t **)0x0) {
      free(p->pObjCopies);
      p->pObjCopies = (Aig_Obj_t **)0x0;
    }
    Saig_ManFilterUsingInd(p,p_02,nConfs,iVar5,fVerbose);
    p_00 = local_38;
    s = local_68;
    pCVar7 = local_78;
    iVar5 = p_02->nSize;
    uVar12 = (ulong)iVar5;
    if (0 < (long)uVar12) {
      uVar13 = 0;
      iVar14 = 0;
      do {
        iVar14 = iVar14 + *(int *)((long)p_02->pArray[uVar13] + 4);
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
      if (iVar14 != 0) {
        uVar13 = 0;
        uVar18 = 0;
        do {
          uVar18 = (ulong)(uint)((int)uVar18 + *(int *)((long)p_02->pArray[uVar13] + 4));
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
        printf("Found %3d constraints after filtering.\n",uVar18);
      }
      if ((fVerbose != 0) && (0 < iVar5)) {
        ppvVar8 = p_02->pArray;
        uVar13 = 0;
        do {
          printf("Level %d. Constr =%d    ",uVar13 & 0xffffffff,
                 (ulong)*(uint *)((long)ppvVar8[uVar13] + 4));
          putchar(10);
          uVar13 = uVar13 + 1;
          s = local_68;
          pCVar7 = local_78;
        } while (uVar12 != uVar13);
      }
    }
  }
  goto LAB_00652cfb;
}

Assistant:

Vec_Vec_t * Saig_ManDetectConstrFunc( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
    int iPat = 0, nWordsAlloc = 16;
    Bar_Progress_t * pProgress = NULL;
    Vec_Vec_t * vCands = NULL;
    Vec_Ptr_t * vInfo, * vNodes;
    Aig_Obj_t * pObj, * pRepr, * pObjNew;
    Aig_Man_t * pFrames;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    unsigned * pInfo;
    int i, j, k, Lit, status, nCands = 0;
    assert( Saig_ManPoNum(p) == 1 );
    if ( Saig_ManPoNum(p) != 1 )
    {
        printf( "The number of outputs is different from 1.\n" );
        return NULL;
    }
//printf( "Implications = %d.\n", Ssw_ManCountImplications(p, nFrames) );

    // perform unrolling
    pFrames = Saig_ManUnrollCOI( p, nFrames );
    assert( Aig_ManCoNum(pFrames) == 1 );
    if ( fVerbose )
    {
        printf( "Detecting constraints with %d frames, %d conflicts, and %d propagations.\n", nFrames, nConfs, nProps );
        printf( "Frames: " );
        Aig_ManPrintStats( pFrames );
    }
//    Aig_ManShow( pFrames, 0, NULL );

    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
//printf( "Implications = %d.\n", pSat->qhead );

    // solve the original problem
    Lit = toLitCond( pCnf->pVarNums[Aig_ObjId(Aig_ManCo(pFrames,0))], 0 );
    status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)nConfs, 0, 0, 0 );
    if ( status == l_False )
    {
        printf( "The problem is trivially UNSAT (inductive with k=%d).\n", nFrames-1 );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Aig_ManStop( pFrames );
        return NULL;
    }
    if ( status == l_Undef )
    {
        printf( "Solver could not solve the original problem.\n" );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Aig_ManStop( pFrames );
        return NULL;
    }
    assert( status == l_True );

    // create simulation info
    vInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pFrames), nWordsAlloc );
    Vec_PtrCleanSimInfo( vInfo, 0, nWordsAlloc );
    Saig_CollectSatValues( pSat, pCnf, vInfo, &iPat );
    Aig_ManForEachObj( pFrames, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        if ( pInfo[0] & 1 )
            memset( (char*)pInfo, 0xff, 4*nWordsAlloc );
    }
//    Aig_ManShow( pFrames, 0, NULL );
//    Aig_ManShow( p, 0, NULL );

    // consider the nodes for ci=>!Out and label when it holds
    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(pFrames) );
    Aig_ManCleanMarkAB( pFrames );
    Aig_ManForEachObj( pFrames, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        Bar_ProgressUpdate( pProgress, i, NULL );
        // check if the node is available in both polarities
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        for ( k = 0; k < nWordsAlloc; k++ )
            if ( pInfo[k] != ~0 )
                break;
        if ( k == nWordsAlloc )
        {
            if ( Saig_DetectTryPolarity(pSat, nConfs, nProps, pCnf, pObj, 0, vInfo, &iPat, fVerbose) ) // !pObj is a constr
            {
                pObj->fMarkA = 1, nCands++;
//                printf( "!%d  ", Aig_ObjId(pObj) );
            }
            continue;
        }
        for ( k = 0; k < nWordsAlloc; k++ )
            if ( pInfo[k] != 0 )
                break;
        if ( k == nWordsAlloc )
        {
            if ( Saig_DetectTryPolarity(pSat, nConfs, nProps, pCnf, pObj, 1, vInfo, &iPat, fVerbose) ) //  pObj is a constr
            {
                pObj->fMarkB = 1, nCands++;
//                printf( "%d  ", Aig_ObjId(pObj) );
            }
            continue;
        }
    }
    Bar_ProgressStop( pProgress );
    if ( nCands )
    {

//        printf( "\n" );
        if ( fVerbose )
            printf( "Found %3d classes of candidates.\n", nCands );
        vCands = Vec_VecAlloc( nFrames );
        for ( k = 0; k < nFrames; k++ )
        {
            Aig_ManForEachObj( p, pObj, i )
            {
                if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                    continue;
                pRepr = p->pObjCopies[nFrames*i + nFrames-1-k];
//                pRepr = p->pObjCopies[nFrames*i + k];
                if ( pRepr == NULL )
                    continue;
                if ( Aig_Regular(pRepr)->fMarkA ) // !pObj is a constr
                {
                    pObjNew = Aig_NotCond(pObj, !Aig_IsComplement(pRepr));

                    for ( j = 0; j < k; j++ )
                        if ( Vec_PtrFind( Vec_VecEntry(vCands, j), pObjNew ) >= 0 )
                            break;
                    if ( j == k )
                        Vec_VecPush( vCands, k, pObjNew );
//                    printf( "%d->!%d ", Aig_ObjId(Aig_Regular(pRepr)), Aig_ObjId(pObj) );
                }
                else if ( Aig_Regular(pRepr)->fMarkB ) //  pObj is a constr
                {
                    pObjNew = Aig_NotCond(pObj,  Aig_IsComplement(pRepr));

                    for ( j = 0; j < k; j++ )
                        if ( Vec_PtrFind( Vec_VecEntry(vCands, j), pObjNew ) >= 0  )
                            break;
                    if ( j == k )
                        Vec_VecPush( vCands, k, pObjNew );
//                    printf( "%d->%d ", Aig_ObjId(Aig_Regular(pRepr)), Aig_ObjId(pObj) );
                }
            }
        }

//        printf( "\n" );
        if ( fVerbose )
        {
            printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
            Vec_VecForEachLevel( vCands, vNodes, k )
            {
                printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
//                Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                    printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( "\n" );
            }
        }

        ABC_FREE( p->pObjCopies );
        Saig_ManFilterUsingInd( p, vCands, nConfs, nProps, fVerbose );
        if ( Vec_VecSizeSize(vCands) )
            printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
        if ( fVerbose )
        {
            Vec_VecForEachLevel( vCands, vNodes, k )
            {
                printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
//                Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                    printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( "\n" );
            }
        }
    }
    Vec_PtrFree( vInfo );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Aig_ManCleanMarkAB( pFrames );
    Aig_ManStop( pFrames );
    return vCands;
}